

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntt_test.cpp
# Opt level: O0

void __thiscall NTT_MultipliesSimple_Test::TestBody(NTT_MultipliesSimple_Test *this)

{
  allocator<long_long> *this_00;
  initializer_list<long_long> __l;
  initializer_list<long_long> __l_00;
  bool bVar1;
  char *message;
  AssertHelper local_120;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  vector<long_long,_std::allocator<long_long>_> want;
  vector<long_long,_std::allocator<long_long>_> res;
  longlong local_c8 [4];
  iterator local_a8;
  size_type local_a0;
  undefined1 local_98 [8];
  vector<long_long,_std::allocator<long_long>_> p2;
  allocator<long_long> local_69;
  longlong local_68 [6];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<long_long,_std::allocator<long_long>_> p1;
  NTT_MultipliesSimple_Test *this_local;
  
  p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  initNTT();
  local_68[2] = 1;
  local_68[3] = 6;
  local_68[0] = 8;
  local_68[1] = 2;
  local_68[4] = 3;
  local_38 = local_68;
  local_30 = 5;
  std::allocator<long_long>::allocator(&local_69);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_28,__l_00,&local_69);
  std::allocator<long_long>::~allocator(&local_69);
  local_c8[0] = 3;
  local_c8[1] = 4;
  local_c8[2] = 2;
  local_a8 = local_c8;
  local_a0 = 3;
  this_00 = (allocator<long_long> *)
            ((long)&res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<long_long>::allocator(this_00);
  __l._M_len = local_a0;
  __l._M_array = local_a8;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_98,__l,this_00);
  std::allocator<long_long>::~allocator
            ((allocator<long_long> *)
             ((long)&res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  multiplyPolynomialsNTT
            ((vector<long_long,_std::allocator<long_long>_> *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<long_long,_std::allocator<long_long>_> *)local_28,
             (vector<long_long,_std::allocator<long_long>_> *)local_98);
  multiplyNaiveNTT((vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,
                   (vector<long_long,_std::allocator<long_long>_> *)local_28,
                   (vector<long_long,_std::allocator<long_long>_> *)local_98);
  testing::internal::EqHelper<false>::
  Compare<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
            ((EqHelper<false> *)local_110,"res","want",
             (vector<long_long,_std::allocator<long_long>_> *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/number-theory/ntt_test.cpp"
               ,0x2b,message);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_98);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_28);
  return;
}

Assistant:

TEST(NTT, MultipliesSimple) {
    initNTT();
    vector<ll> p1 = {8, 2, 1, 6, 3};
    vector<ll> p2 = {3, 4, 2};
    vector<ll> res = multiplyPolynomialsNTT(p1, p2);
    vector<ll> want = multiplyNaiveNTT(p1, p2);
    EXPECT_EQ(res, want);
    //(vector<ll> {24, 38, 27, 26, 35, 24, 6, 0, 0, 0, 0, 0, 0, 0, 0, 0})
}